

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
propset_token_source::insert_token(propset_token_source *this,tc_toktyp_t typ,char *txt,size_t len)

{
  size_t in_RCX;
  char *in_RDX;
  tc_toktyp_t in_ESI;
  CTcToken tok;
  CTcToken *in_stack_ffffffffffffffb8;
  propset_token_source *in_stack_ffffffffffffffc0;
  
  CTcToken::CTcToken((CTcToken *)&stack0xffffffffffffffb8);
  CTcToken::settyp((CTcToken *)&stack0xffffffffffffffb8,in_ESI);
  CTcToken::set_text((CTcToken *)&stack0xffffffffffffffb8,in_RDX,in_RCX);
  insert_token(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void propset_token_source::insert_token(
    tc_toktyp_t typ, const char *txt, size_t len)
{
    /* set up the token object */
    CTcToken tok;
    tok.settyp(typ);
    tok.set_text(txt, len);

    /* insert it */
    insert_token(&tok);
}